

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

uint32 __thiscall MTRand::twist(MTRand *this,uint32 *m,uint32 *s0,uint32 *s1)

{
  ulong uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 *s1_local;
  uint32 *s0_local;
  uint32 *m_local;
  MTRand *this_local;
  
  uVar1 = *m;
  uVar2 = mixBits(this,s0,s1);
  uVar3 = loBit(this,s1);
  return uVar1 ^ uVar2 >> 1 ^ -uVar3 & 0x9908b0df;
}

Assistant:

uint32 twist(const uint32 &m, const uint32 &s0, const uint32 &s1) const {
    return m ^ (mixBits(s0, s1) >> 1) ^
           (-static_cast<long>(loBit(s1)) & 0x9908b0dfUL);
  }